

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall
tinyxml2::XMLNode::ParseDeep(XMLNode *this,char *p,StrPair *parentEndTag,int *curLineNumPtr)

{
  XMLDocument *pXVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ElementClosingType EVar5;
  char *pcVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLNode *pXVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  XMLElement *this_00;
  char *q;
  bool mismatch;
  XMLElement *ele;
  bool wellLocated;
  XMLDeclaration *decl;
  StrPair endTag;
  XMLNode *pXStack_50;
  int initialLineNum;
  XMLNode *node;
  DepthTracker local_38;
  DepthTracker tracker;
  int *curLineNumPtr_local;
  StrPair *parentEndTag_local;
  char *p_local;
  XMLNode *this_local;
  undefined4 extraout_var_04;
  
  tracker._document = (XMLDocument *)curLineNumPtr;
  XMLDocument::DepthTracker::DepthTracker(&local_38,this->_document);
  bVar2 = XMLDocument::Error(this->_document);
  parentEndTag_local = (StrPair *)p;
  if (bVar2) {
    this_local = (XMLNode *)0x0;
    node._0_4_ = 1;
  }
  else {
    do {
      bVar2 = false;
      if (parentEndTag_local != (StrPair *)0x0) {
        bVar2 = (char)parentEndTag_local->_flags != '\0';
      }
      if (!bVar2) goto LAB_0013adcb;
      pXStack_50 = (XMLNode *)0x0;
      pcVar6 = XMLDocument::Identify
                         (this->_document,(char *)parentEndTag_local,&stack0xffffffffffffffb0);
      if (pXStack_50 == (XMLNode *)0x0) goto LAB_0013adcb;
      endTag._end._4_4_ = pXStack_50->_parseLineNum;
      StrPair::StrPair((StrPair *)&decl);
      iVar3 = (*pXStack_50->_vptr_XMLNode[0x11])(pXStack_50,pcVar6,&decl,tracker._document);
      parentEndTag_local = (StrPair *)CONCAT44(extraout_var,iVar3);
      if ((XMLNode *)parentEndTag_local == (XMLNode *)0x0) {
        DeleteNode(pXStack_50);
        bVar2 = XMLDocument::Error(this->_document);
        if (!bVar2) {
          XMLDocument::SetError(this->_document,XML_ERROR_PARSING,endTag._end._4_4_,(char *)0x0);
        }
        node._0_4_ = 3;
      }
      else {
        iVar3 = (*pXStack_50->_vptr_XMLNode[4])();
        if ((XMLNode *)CONCAT44(extraout_var_00,iVar3) != (XMLNode *)0x0) {
          bVar2 = false;
          iVar4 = (*this->_vptr_XMLNode[3])();
          if (CONCAT44(extraout_var_01,iVar4) != 0) {
            pXVar7 = FirstChild(this);
            if (pXVar7 == (XMLNode *)0x0) {
              bVar2 = true;
            }
            else {
              pXVar7 = FirstChild(this);
              bVar2 = false;
              if (pXVar7 != (XMLNode *)0x0) {
                pXVar7 = FirstChild(this);
                iVar4 = (*pXVar7->_vptr_XMLNode[4])();
                bVar2 = false;
                if (CONCAT44(extraout_var_02,iVar4) != 0) {
                  pXVar7 = LastChild(this);
                  bVar2 = false;
                  if (pXVar7 != (XMLNode *)0x0) {
                    pXVar7 = LastChild(this);
                    iVar4 = (*pXVar7->_vptr_XMLNode[4])();
                    bVar2 = CONCAT44(extraout_var_03,iVar4) != 0;
                  }
                }
              }
            }
          }
          iVar4 = endTag._end._4_4_;
          if (!bVar2) {
            pXVar1 = this->_document;
            pcVar6 = Value((XMLNode *)CONCAT44(extraout_var_00,iVar3));
            XMLDocument::SetError
                      (pXVar1,XML_ERROR_PARSING_DECLARATION,iVar4,"XMLDeclaration value=%s",pcVar6);
            DeleteNode(pXStack_50);
            node._0_4_ = 3;
            goto LAB_0013ada1;
          }
        }
        iVar3 = (**pXStack_50->_vptr_XMLNode)();
        this_00 = (XMLElement *)CONCAT44(extraout_var_04,iVar3);
        if (this_00 == (XMLElement *)0x0) {
LAB_0013ad88:
          InsertEndChild(this,pXStack_50);
          node._0_4_ = 0;
        }
        else {
          EVar5 = XMLElement::ClosingType(this_00);
          if (EVar5 == CLOSING) {
            if (parentEndTag != (StrPair *)0x0) {
              StrPair::TransferTo(&(this_00->super_XMLNode)._value,parentEndTag);
            }
            (*pXStack_50->_memPool->_vptr_MemPool[5])();
            DeleteNode(pXStack_50);
            node._0_4_ = 1;
            this_local = (XMLNode *)parentEndTag_local;
          }
          else {
            bVar2 = StrPair::Empty((StrPair *)&decl);
            if (bVar2) {
              EVar5 = XMLElement::ClosingType(this_00);
              bVar2 = EVar5 == OPEN;
            }
            else {
              EVar5 = XMLElement::ClosingType(this_00);
              if (EVar5 == OPEN) {
                pcVar6 = StrPair::GetStr((StrPair *)&decl);
                q = XMLElement::Name(this_00);
                bVar2 = XMLUtil::StringEqual(pcVar6,q,0x7fffffff);
                bVar2 = !bVar2;
              }
              else {
                bVar2 = true;
              }
            }
            iVar3 = endTag._end._4_4_;
            if (!bVar2) goto LAB_0013ad88;
            pXVar1 = this->_document;
            pcVar6 = XMLElement::Name(this_00);
            XMLDocument::SetError
                      (pXVar1,XML_ERROR_MISMATCHED_ELEMENT,iVar3,"XMLElement name=%s",pcVar6);
            DeleteNode(pXStack_50);
            node._0_4_ = 3;
          }
        }
      }
LAB_0013ada1:
      StrPair::~StrPair((StrPair *)&decl);
    } while ((int)node == 0);
    if ((int)node == 3) {
LAB_0013adcb:
      this_local = (XMLNode *)0x0;
      node._0_4_ = 1;
    }
  }
  XMLDocument::DepthTracker::~DepthTracker(&local_38);
  return (char *)this_local;
}

Assistant:

char* XMLNode::ParseDeep(char* p, StrPair* parentEndTag, int* curLineNumPtr)
{
    // This is a recursive method, but thinking about it "at the current level"
    // it is a pretty simple flat list:
    //		<foo/>
    //		<!-- comment -->
    //
    // With a special case:
    //		<foo>
    //		</foo>
    //		<!-- comment -->
    //
    // Where the closing element (/foo) *must* be the next thing after the opening
    // element, and the names must match. BUT the tricky bit is that the closing
    // element will be read by the child.
    //
    // 'endTag' is the end tag for this node, it is returned by a call to a child.
    // 'parentEnd' is the end tag for the parent, which is filled in and returned.

    XMLDocument::DepthTracker tracker(_document);
    if (_document->Error()) return 0;

    while (p && *p) {
        XMLNode* node = 0;

        p = _document->Identify(p, &node);
        TIXMLASSERT(p);
        if (node == 0) {
            break;
        }

        const int initialLineNum = node->_parseLineNum;

        StrPair endTag;
        p = node->ParseDeep(p, &endTag, curLineNumPtr);
        if (!p) {
            DeleteNode(node);
            if (!_document->Error()) {
                _document->SetError(XML_ERROR_PARSING, initialLineNum, 0);
            }
            break;
        }

        const XMLDeclaration* const decl = node->ToDeclaration();
        if (decl) {
            // Declarations are only allowed at document level
            //
            // Multiple declarations are allowed but all declarations
            // must occur before anything else.
            //
            // Optimized due to a security test case. If the first node is
            // a declaration, and the last node is a declaration, then only
            // declarations have so far been added.
            bool wellLocated = false;

            if (ToDocument()) {
                if (FirstChild()) {
                    wellLocated = FirstChild() && FirstChild()->ToDeclaration() && LastChild() &&
                        LastChild()->ToDeclaration();
                } else {
                    wellLocated = true;
                }
            }
            if (!wellLocated) {
                _document->SetError(
                    XML_ERROR_PARSING_DECLARATION,
                    initialLineNum,
                    "XMLDeclaration value=%s",
                    decl->Value());
                DeleteNode(node);
                break;
            }
        }

        XMLElement* ele = node->ToElement();
        if (ele) {
            // We read the end tag. Return it to the parent.
            if (ele->ClosingType() == XMLElement::CLOSING) {
                if (parentEndTag) {
                    ele->_value.TransferTo(parentEndTag);
                }
                node->_memPool->SetTracked(); // created and then immediately deleted.
                DeleteNode(node);
                return p;
            }

            // Handle an end tag returned to this level.
            // And handle a bunch of annoying errors.
            bool mismatch = false;
            if (endTag.Empty()) {
                if (ele->ClosingType() == XMLElement::OPEN) {
                    mismatch = true;
                }
            } else {
                if (ele->ClosingType() != XMLElement::OPEN) {
                    mismatch = true;
                } else if (!XMLUtil::StringEqual(endTag.GetStr(), ele->Name())) {
                    mismatch = true;
                }
            }
            if (mismatch) {
                _document->SetError(
                    XML_ERROR_MISMATCHED_ELEMENT,
                    initialLineNum,
                    "XMLElement name=%s",
                    ele->Name());
                DeleteNode(node);
                break;
            }
        }
        InsertEndChild(node);
    }
    return 0;
}